

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl.c
# Opt level: O2

void QDLDL_Lsolve(QDLDL_int n,QDLDL_int *Lp,QDLDL_int *Li,QDLDL_float *Lx,QDLDL_float *x)

{
  long lVar1;
  long lVar2;
  long lVar3;
  QDLDL_int QVar4;
  
  lVar2 = 0;
  if (n < 1) {
    n = lVar2;
  }
  while (lVar3 = lVar2, lVar3 != n) {
    lVar1 = Lp[lVar3 + 1];
    for (QVar4 = Lp[lVar3]; lVar2 = lVar3 + 1, QVar4 < lVar1; QVar4 = QVar4 + 1) {
      x[Li[QVar4]] = x[Li[QVar4]] - Lx[QVar4] * x[lVar3];
    }
  }
  return;
}

Assistant:

void QDLDL_Lsolve(const QDLDL_int    n,
                  const QDLDL_int*   Lp,
                  const QDLDL_int*   Li,
                  const QDLDL_float* Lx,
                  QDLDL_float* x){

QDLDL_int i,j;
  for(i = 0; i < n; i++){
      for(j = Lp[i]; j < Lp[i+1]; j++){
          x[Li[j]] -= Lx[j]*x[i];
      }
  }
}